

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O2

ClauseGenerationResult __thiscall
Inferences::CompositeSGI::generateSimplify(CompositeSGI *this,Clause *cl)

{
  SplitSet *pSVar1;
  undefined8 *puVar2;
  ClauseIterator this_00;
  char cVar3;
  Stack<Lib::VirtualIterator<Kernel::Clause_*>_> *in_RDX;
  Stack<Lib::VirtualIterator<Kernel::Clause_*>_> *extraout_RDX;
  Stack<Lib::VirtualIterator<Kernel::Clause_*>_> *extraout_RDX_00;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>
  *it;
  undefined8 extraout_RDX_01;
  undefined1 uVar4;
  SplitSet *pSVar5;
  undefined8 *puVar6;
  ClauseGenerationResult CVar7;
  ClauseGenerationResult res;
  VirtualIterator<Kernel::Clause_*> local_108;
  Clause *local_100;
  ClauseIterator local_f8;
  VirtualIterator<Kernel::Clause_*> local_f0;
  VirtualIterator<Kernel::Clause_*> local_e8;
  char local_e0;
  Stack<Lib::VirtualIterator<Kernel::Clause_*>_> local_d8;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>
  local_b0;
  FlatteningIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>_>
  local_78;
  
  local_d8._cursor = (VirtualIterator<Kernel::Clause_*> *)0x0;
  local_d8._end = (VirtualIterator<Kernel::Clause_*> *)0x0;
  local_d8._capacity = 0;
  local_d8._stack = (VirtualIterator<Kernel::Clause_*> *)0x0;
  pSVar5 = (cl->super_Unit)._inference._splits;
  pSVar1 = (SplitSet *)(cl->super_Unit)._inference._ptr1;
  local_100 = cl;
  local_f8._core = (IteratorCore<Kernel::Clause_*> *)this;
  do {
    if (pSVar5 == pSVar1) {
      puVar2 = *(undefined8 **)&local_100->_weight;
      for (puVar6 = *(undefined8 **)&local_100->field_0x38; puVar6 != puVar2; puVar6 = puVar6 + 1) {
        (**(code **)(*(long *)*puVar6 + 0x30))(&local_f0);
        Lib::Stack<Lib::VirtualIterator<Kernel::Clause_*>_>::push(&local_d8,&local_f0);
        Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator(&local_f0);
        in_RDX = extraout_RDX_00;
      }
      uVar4 = 0;
      goto LAB_00402a45;
    }
    (**(code **)(*(long *)pSVar5->_size + 0x28))(&local_e8);
    local_108._core = local_e8._core;
    if (local_e8._core != (IteratorCore<Kernel::Clause_*> *)0x0) {
      (local_e8._core)->_refCnt = (local_e8._core)->_refCnt + 1;
    }
    Lib::Stack<Lib::VirtualIterator<Kernel::Clause_*>_>::push(&local_d8,&local_108);
    Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator(&local_108);
    cVar3 = local_e0;
    Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator(&local_e8);
    pSVar5 = (SplitSet *)pSVar5->_items;
    in_RDX = extraout_RDX;
  } while (cVar3 == '\0');
  uVar4 = 1;
LAB_00402a45:
  Lib::arrayIter<Lib::Stack<Lib::VirtualIterator<Kernel::Clause*>>>
            (&local_b0,(Lib *)&local_d8,in_RDX);
  this_00._core = local_f8._core;
  Lib::
  getFlattenedIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Lib::VirtualIterator<Kernel::Clause*>>,unsigned_long>(Lib::Stack<Lib::VirtualIterator<Kernel::Clause*>>&&,unsigned_long)::_lambda(auto:1)_1_,Lib::VirtualIterator<Kernel::Clause*>>>>
            (&local_78,(Lib *)&local_b0,it);
  Lib::
  pvi<Lib::FlatteningIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Lib::VirtualIterator<Kernel::Clause*>>,unsigned_long>(Lib::Stack<Lib::VirtualIterator<Kernel::Clause*>>&&,unsigned_long)::_lambda(auto:1)_1_,Lib::VirtualIterator<Kernel::Clause*>>>>>
            ((Lib *)this_00._core,&local_78);
  *(undefined1 *)&(this_00._core)->_refCnt = uVar4;
  Lib::
  FlatteningIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>_>
  ::~FlatteningIterator(&local_78);
  Lib::Stack<Lib::VirtualIterator<Kernel::Clause_*>_>::~Stack
            ((Stack<Lib::VirtualIterator<Kernel::Clause_*>_> *)&local_b0);
  Lib::Stack<Lib::VirtualIterator<Kernel::Clause_*>_>::~Stack(&local_d8);
  CVar7._8_8_ = extraout_RDX_01;
  CVar7.clauses._core = this_00._core;
  return CVar7;
}

Assistant:

CompositeSGI::ClauseGenerationResult CompositeSGI::generateSimplify(Kernel::Clause* cl)
{
  auto redundant = false;
  Stack<ClauseIterator> clauses;
  /* apply generations as until a redundancy is discovered */
  for (auto simpl : _simplifiers) {
    auto res = simpl->generateSimplify(cl);
    clauses.push(res.clauses);
    if (res.premiseRedundant) {
      redundant = true;
      break;
    }
  }
  if (!redundant) {
    /* apply strictly generating rules if there hasn't been a redundancy */
    for (auto gen : _generators) {
      clauses.push(gen->generateClauses(cl));
    }
  }
  return ClauseGenerationResult {
    .clauses          = pvi(getFlattenedIterator(arrayIter(std::move(clauses)))),
    .premiseRedundant = redundant,
  };
}